

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_phys.c
# Opt level: O3

REF_STATUS
ref_phys_bcast_parts
          (REF_MPI ref_mpi,REF_INT *part_complete,REF_INT *part_ncell,REF_INT max_ncell,
          REF_INT node_per,REF_DBL *param_6,REF_INT *ncell,REF_DBL **xyz)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  void *pvVar5;
  uint uVar6;
  long lVar7;
  ulong uVar8;
  undefined8 uVar9;
  int iVar10;
  uint uVar11;
  undefined4 in_register_00000084;
  char *pcVar12;
  long lVar13;
  
  iVar1 = *part_complete;
  lVar13 = (long)iVar1;
  if (iVar1 < ref_mpi->n) {
    iVar3 = part_ncell[lVar13];
    iVar2 = 0;
    lVar7 = lVar13;
    do {
      iVar10 = iVar2;
      lVar7 = lVar7 + 1;
      *(int *)param_6 = iVar3;
      if (ref_mpi->n <= lVar7) break;
      iVar3 = iVar3 + part_ncell[lVar7];
      iVar2 = iVar10 + -1;
    } while (iVar3 < 0xf4241);
    iVar10 = iVar1 - iVar10;
    iVar3 = iVar10 + 1;
    *part_complete = iVar3;
    iVar2 = max_ncell * 3;
    uVar6 = *(int *)param_6 * iVar2;
    if (-1 < (int)uVar6) {
      pvVar5 = malloc((ulong)uVar6 << 3);
      *(void **)ncell = pvVar5;
      if (pvVar5 == (void *)0x0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",
               0x64e,"ref_phys_bcast_parts","malloc *xyz of REF_DBL NULL");
        return 2;
      }
      uVar11 = 0;
      if (iVar1 <= iVar10) {
        uVar11 = 0;
        do {
          iVar1 = part_ncell[lVar13];
          uVar6 = iVar1 * iVar2;
          if (ref_mpi->id == (int)lVar13) {
            if (0 < iVar1) {
              uVar4 = ref_mpi_bcast_from_rank
                                (ref_mpi,(void *)CONCAT44(in_register_00000084,node_per),uVar6,3,
                                 ref_mpi->id);
              if (uVar4 != 0) {
                uVar9 = 0x657;
                goto LAB_001d5462;
              }
              if (0 < (int)uVar6) {
                lVar7 = *(long *)ncell;
                uVar8 = 0;
                do {
                  *(undefined8 *)((long)(int)uVar11 * 8 + lVar7 + uVar8 * 8) =
                       *(undefined8 *)((long)CONCAT44(in_register_00000084,node_per) + uVar8 * 8);
                  uVar8 = uVar8 + 1;
                } while (uVar6 != uVar8);
              }
            }
          }
          else if ((0 < iVar1) &&
                  (uVar4 = ref_mpi_bcast_from_rank
                                     (ref_mpi,(void *)((long)(int)uVar11 * 8 + *(long *)ncell),uVar6
                                      ,3,(int)lVar13), uVar4 != 0)) {
            uVar9 = 0x65e;
LAB_001d5462:
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",
                   uVar9,"ref_phys_bcast_parts",(ulong)uVar4,"bcast ncell");
            return uVar4;
          }
          uVar11 = uVar6 + uVar11;
          lVar13 = lVar13 + 1;
        } while (iVar3 != (int)lVar13);
        uVar6 = iVar2 * *(int *)param_6;
      }
      if (uVar6 != uVar11) {
        printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",
               0x664,"ref_phys_bcast_parts","miscount",(long)(int)uVar6,(long)(int)uVar11);
      }
      return (uint)(uVar6 != uVar11);
    }
    pcVar12 = "malloc *xyz of REF_DBL negative";
    uVar9 = 0x64e;
  }
  else {
    pcVar12 = "already complete";
    uVar9 = 0x641;
  }
  printf("%s: %d: %s: %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",uVar9,
         "ref_phys_bcast_parts",pcVar12);
  return 1;
}

Assistant:

REF_FCN static REF_STATUS ref_phys_bcast_parts(
    REF_MPI ref_mpi, REF_INT *part_complete, REF_INT *part_ncell,
    REF_INT max_ncell, REF_INT node_per, REF_DBL *local_xyz, REF_INT *ncell,
    REF_DBL **xyz) {
  REF_INT total;
  REF_INT first_part, last_part;
  REF_INT offset, part, i;
  RAS(*part_complete < ref_mpi_n(ref_mpi), "already complete");
  first_part = *part_complete;
  last_part = *part_complete;
  (*ncell) = part_ncell[first_part];

  for (part = first_part + 1; part < ref_mpi_n(ref_mpi); part++) {
    if ((*ncell) + part_ncell[part] > max_ncell) break;
    last_part = part;
    (*ncell) += part_ncell[part];
  }
  (*part_complete) = last_part + 1;

  total = 3 * node_per * (*ncell);
  ref_malloc(*xyz, total, REF_DBL);

  offset = 0;
  for (part = first_part; part <= last_part; part++) {
    total = 3 * node_per * part_ncell[part];
    if (part == ref_mpi_rank(ref_mpi)) {
      if (part_ncell[part] > 0) {
        RSS(ref_mpi_bcast_from_rank(ref_mpi, local_xyz, total, REF_DBL_TYPE,
                                    part),
            "bcast ncell");
        for (i = 0; i < total; i++) (*xyz)[i + offset] = local_xyz[i];
      }
    } else {
      if (part_ncell[part] > 0) {
        RSS(ref_mpi_bcast_from_rank(ref_mpi, &((*xyz)[offset]), total,
                                    REF_DBL_TYPE, part),
            "bcast ncell");
      }
    }
    offset += total;
  }
  total = 3 * node_per * (*ncell);
  REIS(total, offset, "miscount");

  return REF_SUCCESS;
}